

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderBarrier.cpp
# Opt level: O2

bool __thiscall
glcts::TessellationShaderBarrier3::verifyXFBBuffer(TessellationShaderBarrier3 *this,void *data)

{
  long lVar1;
  int *piVar2;
  ostringstream *this_00;
  uint n;
  uint uVar3;
  ostream *poVar4;
  TestError *this_01;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  uint n_patch_vertex_1;
  vector<int,_std::allocator<int>_> tcs_patch_result;
  vector<int,_std::allocator<int>_> tcs_data;
  char *local_358 [4];
  stringstream logMessage;
  ostream local_328;
  undefined1 local_1b0 [384];
  
  _logMessage = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&tcs_data,(ulong)this->m_n_invocations,(value_type_conflict1 *)&logMessage,
             (allocator_type *)local_1b0);
  _logMessage = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&tcs_patch_result,(ulong)this->m_n_invocations,(value_type_conflict1 *)&logMessage,
             (allocator_type *)local_1b0);
  for (uVar3 = 0; uVar5 = this->m_n_invocations, uVar3 < uVar5; uVar3 = uVar3 + 2) {
    tcs_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [uVar3] = uVar3;
  }
  for (uVar3 = 1; uVar3 < uVar5; uVar3 = uVar3 + 2) {
    tcs_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [uVar3] = tcs_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar3 - 1] + uVar3;
    uVar5 = this->m_n_invocations;
  }
  for (uVar8 = 0; uVar8 < uVar5; uVar8 = uVar8 + 1) {
    tcs_patch_result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar8] = 0;
    if ((uVar8 & 3) == 0) {
      iVar6 = tcs_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar8];
      tcs_patch_result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start[uVar8] = iVar6;
      iVar6 = iVar6 + tcs_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar8 + 1];
      tcs_patch_result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start[uVar8] = iVar6;
      iVar6 = iVar6 + tcs_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar8 + 2];
      tcs_patch_result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start[uVar8] = iVar6;
      tcs_patch_result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start[uVar8] =
           iVar6 + tcs_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar8 + 3];
    }
    uVar5 = this->m_n_invocations;
  }
  uVar3 = 0;
  uVar8 = 0;
  do {
    if ((ulong)this->m_n_result_vertices / (ulong)uVar5 <= uVar8) {
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&tcs_patch_result.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&tcs_data.super__Vector_base<int,_std::allocator<int>_>);
      return true;
    }
    uVar9 = 0;
    while (uVar5 != uVar9) {
      lVar1 = uVar9 * 4;
      piVar2 = tcs_patch_result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + uVar9;
      uVar9 = uVar9 + 1;
      if (*(int *)((long)data + lVar1 + (ulong)uVar3 * 4) != *piVar2) {
        std::__cxx11::stringstream::stringstream((stringstream *)&logMessage);
        poVar4 = std::operator<<(&local_328,"Result data for patch [");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::operator<<(poVar4,"]: (");
        for (uVar8 = 0; uVar8 < this->m_n_patch_vertices; uVar8 = uVar8 + 1) {
          std::ostream::operator<<(&local_328,*(int *)((long)data + uVar8 * 4 + (ulong)uVar3 * 4));
          pcVar7 = " , ";
          if (uVar8 == this->m_n_patch_vertices - 1) {
            pcVar7 = " ), ";
          }
          std::operator<<(&local_328,pcVar7 + 1);
        }
        std::operator<<(&local_328,"expected: ");
        for (uVar8 = 0; uVar8 < this->m_n_patch_vertices; uVar8 = uVar8 + 1) {
          std::ostream::operator<<
                    (&local_328,
                     tcs_patch_result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar8]);
          pcVar7 = ", ";
          if (uVar8 == this->m_n_patch_vertices - 1) {
            pcVar7 = "). ";
          }
          std::operator<<(&local_328,pcVar7);
        }
        local_1b0._0_8_ =
             ((this->super_TessellationShaderBarrierTestCase).super_TestCaseBase.super_TestCase.
              super_TestNode.m_testCtx)->m_log;
        this_00 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__cxx11::stringbuf::str();
        std::operator<<((ostream *)this_00,local_358[0]);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)local_358);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,"Invalid data captured",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderBarrier.cpp"
                   ,0x3d8);
        __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
    }
    uVar8 = uVar8 + 1;
    uVar3 = uVar3 + uVar5 * 2;
  } while( true );
}

Assistant:

bool TessellationShaderBarrier3::verifyXFBBuffer(const void* data)
{
	const int*		 data_int = (const int*)data;
	std::vector<int> tcs_data(m_n_invocations, 0);
	std::vector<int> tcs_patch_result(m_n_invocations, 0);

	/* This is a simple C++ port of the TCS used for the test.
	 *
	 * Note: We only need to consider a single set of values stored by TES
	 *       for a single result point, as the same set of values will be
	 *       reported for the other point. Owing to the fact gl_InvocationID
	 *       in TCS will iterate from 0 to 15 for all input patches and instances,
	 *       we can re-use the data for all subsequent input patches. */
	/* Phase 1 */
	for (unsigned int n = 0; n < m_n_invocations; n += 2)
	{
		tcs_data[n] = n;
	}

	/* Phase 2 */
	for (unsigned int n = 1; n < m_n_invocations; n += 2)
	{
		tcs_data[n] = tcs_data[n - 1] + n;
	}

	/* Phase 3 */
	for (unsigned int n_patch_vertex = 0; n_patch_vertex < m_n_invocations; ++n_patch_vertex)
	{
		const unsigned int invocation_id = n_patch_vertex;

		tcs_patch_result[invocation_id] = 0;

		if ((invocation_id % 4) == 0)
		{
			tcs_patch_result[invocation_id] += tcs_data[invocation_id];
			tcs_patch_result[invocation_id] += tcs_data[invocation_id + 1];
			tcs_patch_result[invocation_id] += tcs_data[invocation_id + 2];
			tcs_patch_result[invocation_id] += tcs_data[invocation_id + 3];
		}
	} /* for (all patch vertices) */

	/* Time to do the actual comparison. */
	for (unsigned int n_patch = 0; n_patch < m_n_result_vertices / m_n_invocations; ++n_patch)
	{
		bool	   are_equal				 = true;
		const int  n_points_per_line_segment = 2;
		const int* patch_data_int			 = data_int + n_patch * m_n_invocations * n_points_per_line_segment;

		for (unsigned int n_invocation = 0; n_invocation < m_n_invocations; ++n_invocation)
		{
			if (patch_data_int[n_invocation] != tcs_patch_result[n_invocation])
			{
				are_equal = false;

				break;
			}
		} /* for (all patch vertices which have contributed for given input patch being considered) */

		if (!are_equal)
		{
			std::stringstream logMessage;

			logMessage << "Result data for patch [" << n_patch << "]: (";

			for (unsigned int n_patch_vertex = 0; n_patch_vertex < m_n_patch_vertices; ++n_patch_vertex)
			{
				logMessage << patch_data_int[n_patch_vertex];

				if (n_patch_vertex == (m_n_patch_vertices - 1))
				{
					logMessage << "), ";
				}
				else
				{
					logMessage << ", ";
				}
			} /* for (all patch vertices) */

			logMessage << "expected: ";

			for (unsigned int n_patch_vertex = 0; n_patch_vertex < m_n_patch_vertices; ++n_patch_vertex)
			{
				logMessage << tcs_patch_result[n_patch_vertex];

				if (n_patch_vertex == (m_n_patch_vertices - 1))
				{
					logMessage << "). ";
				}
				else
				{
					logMessage << ", ";
				}
			} /* for (all patch vertices) */

			/* Log the message */
			m_testCtx.getLog() << tcu::TestLog::Message << logMessage.str().c_str() << tcu::TestLog::EndMessage;

			/* Bail out */
			TCU_FAIL("Invalid data captured");
		} /* if (!are_equal) */
	}	 /* for (all patches) */

	return true;
}